

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  domain_error *pdVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar8;
  ostringstream oss;
  allocator local_2f2;
  allocator local_2f1;
  TagAliasRegistry *local_2f0;
  char *local_2e8 [2];
  char local_2d8 [16];
  pair<const_char_*,_Catch::TagAlias> local_2c8;
  string local_278;
  SourceLineInfo local_258;
  string local_230;
  string local_210;
  TagAlias local_1f0;
  value_type local_1a8 [3];
  
  local_2f0 = this;
  std::__cxx11::string::string((string *)local_1a8,alias,(allocator *)local_2e8);
  local_2c8.first = (char *)&local_2c8.second.tag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"[@","");
  bVar4 = startsWith(&local_1a8[0].first,(string *)&local_2c8);
  bVar5 = true;
  if (bVar4) {
    std::__cxx11::string::string((string *)&local_210,alias,&local_2f1);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"]","");
    bVar5 = endsWith(&local_210,&local_278);
    bVar5 = !bVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2)) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  if ((size_type *)local_2c8.first != &local_2c8.second.tag._M_string_length) {
    operator_delete(local_2c8.first);
  }
  paVar1 = &local_1a8[0].first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].first._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0].first._M_dataplus._M_p);
  }
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"error: tag alias, \"",0x13);
    poVar6 = std::operator<<((ostream *)local_1a8,alias);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\" is not of the form [@alias name].\n",0x24);
    operator<<(poVar6,lineInfo);
    pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)&local_2c8,local_2e8[0],&local_2f2);
    std::domain_error::domain_error(pdVar7,(string *)&local_2c8);
    __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::string::string((string *)&local_230,tag,&local_2f2);
  paVar2 = &local_258.file.field_2;
  pcVar3 = (lineInfo->file)._M_dataplus._M_p;
  local_258.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar3,pcVar3 + (lineInfo->file)._M_string_length);
  local_258.line = lineInfo->line;
  TagAlias::TagAlias(&local_1f0,&local_230,&local_258);
  local_2e8[0] = alias;
  std::pair<const_char_*,_Catch::TagAlias>::pair(&local_2c8,local_2e8,&local_1f0);
  std::pair<std::__cxx11::string_const,Catch::TagAlias>::pair<char_const*,Catch::TagAlias>
            ((pair<std::__cxx11::string_const,Catch::TagAlias> *)local_1a8,&local_2c8);
  pVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
          ::_M_insert_unique(&(local_2f0->m_registry)._M_t,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].second.lineInfo.file._M_dataplus._M_p !=
      &local_1a8[0].second.lineInfo.file.field_2) {
    operator_delete(local_1a8[0].second.lineInfo.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].second.tag._M_dataplus._M_p != &local_1a8[0].second.tag.field_2) {
    operator_delete(local_1a8[0].second.tag._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].first._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0].first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.second.lineInfo.file._M_dataplus._M_p != &local_2c8.second.lineInfo.file.field_2)
  {
    operator_delete(local_2c8.second.lineInfo.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.second.tag._M_dataplus._M_p != &local_2c8.second.tag.field_2) {
    operator_delete(local_2c8.second.tag._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.lineInfo.file._M_dataplus._M_p != &local_1f0.lineInfo.file.field_2) {
    operator_delete(local_1f0.lineInfo.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.tag._M_dataplus._M_p != &local_1f0.tag.field_2) {
    operator_delete(local_1f0.tag._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"error: tag alias, \"",0x13);
  poVar6 = std::operator<<((ostream *)local_1a8,alias);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" already registered.\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tFirst seen at ",0xf);
  std::__cxx11::string::string((string *)local_2e8,alias,&local_2f2);
  (*(local_2f0->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_2c8,local_2f0,local_2e8)
  ;
  operator<<(poVar6,(SourceLineInfo *)((long)local_2c8.first + 0x20));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tRedefined at ",0xe);
  operator<<(poVar6,lineInfo);
  Option<Catch::TagAlias>::reset((Option<Catch::TagAlias> *)&local_2c8);
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0]);
  }
  pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_2c8,local_2e8[0],&local_2f2);
  std::domain_error::domain_error(pdVar7,(string *)&local_2c8);
  __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }